

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

State __thiscall QAccessibleTabButton::state(QAccessibleTabButton *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long *plVar6;
  undefined8 uVar7;
  long *in_RDI;
  long in_FS_OFFSET;
  State s;
  QTabBar *in_stack_ffffffffffffffc8;
  State local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (**(code **)(*in_RDI + 0x10))();
  if ((uVar5 & 1) == 0) {
    QAccessible::State::State((State *)0x7d70e5);
    local_10 = (State)&DAT_aaaaaaaaaaaaaaaa;
  }
  else {
    plVar6 = (long *)(**(code **)(*in_RDI + 0x40))();
    uVar7 = (**(code **)(*plVar6 + 0x80))();
    local_10._0_5_ = SUB85(uVar7,0);
    local_10._5_3_ = 0xaaaaaa;
    uVar5 = CONCAT44(local_10._4_4_,(int)uVar7) & 0xffffffffffbfffff;
    lVar2 = in_RDI[4];
    QPointer<QTabBar>::operator->((QPointer<QTabBar> *)0x7d715d);
    iVar3 = QTabBar::currentIndex(in_stack_ffffffffffffffc8);
    uVar4 = (uint)((int)lVar2 == iVar3);
    local_10._4_4_ = SUB84(uVar5 >> 0x20,0);
    local_10._0_4_ = (uint)uVar5 & 0xfffffff5 | 0x400000 | uVar4 << 3 | uVar4 << 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QAccessible::State state() const override {
        if (!isValid()) {
            QAccessible::State s;
            s.invalid = true;
            return s;
        }

        QAccessible::State s = parent()->state();
        s.selectable = true;
        s.focused = (m_index == m_parent->currentIndex());
        s.selected = s.focused;
        return s;
    }